

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_serializer.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
net_serializer<std::vector<double,_std::allocator<double>_>,_void>::deserialize
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,istream *in)

{
  pointer pdVar1;
  int iVar2;
  vector<double,_std::allocator<double>_> *__range2;
  double *i;
  pointer pdVar3;
  double dVar4;
  allocator_type local_21;
  
  iVar2 = net_serializer<int,_void>::deserialize(in);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,(long)iVar2,&local_21)
  ;
  pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
    dVar4 = net_serializer<double,_void>::deserialize(in);
    *pdVar3 = dVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<T> deserialize(std::istream& in){
        int size = net_serializer<int>::deserialize(in);
        std::vector<T> data(size);
        for (auto& i:data)
            i = net_serializer<T>::deserialize(in);
        return data;
    }